

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::NamedBase::AddDescriptionPostfix
          (NamedBase *this,string *dest,bool isManual,string *manual,bool isGenerated,
          string *generated,string *str)

{
  size_type sVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,isManual) == 0) {
    if (!isGenerated) {
      return;
    }
    sVar1 = generated->_M_string_length;
  }
  else {
    sVar1 = manual->_M_string_length;
    generated = manual;
  }
  if (sVar1 == 0) {
    return;
  }
  std::__cxx11::string::_M_append((char *)dest,(ulong)(str->_M_dataplus)._M_p);
  std::__cxx11::string::_M_append((char *)dest,(ulong)(generated->_M_dataplus)._M_p);
  return;
}

Assistant:

void AddDescriptionPostfix(std::string &dest, const bool isManual, const std::string &manual, bool isGenerated, const std::string &generated, const std::string &str) const
            {
                if (isManual && !manual.empty())
                {
                    dest += str;
                    dest += manual;
                }
                else if (!isManual && isGenerated && !generated.empty())
                {
                    dest += str;
                    dest += generated;
                }
            }